

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idx2Common.cpp
# Opt level: O3

grid * idx2::GetGrid(grid *__return_storage_ptr__,idx2_file *Idx2,extent *Ext)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  long lVar4;
  int iVar5;
  int iVar6;
  uint uVar7;
  int iVar8;
  uint uVar9;
  int iVar10;
  uint uVar11;
  long lVar12;
  ulong uVar13;
  int iVar14;
  int iVar15;
  extent eVar16;
  v3i Strd3;
  extent local_40;
  
  local_40.Dims =
       (ulong)((Idx2->Dims3).field_0.field_0.Z & 0x1fffff) << 0x2a |
       ((ulong)(uint)(Idx2->Dims3).field_0.field_0.Y & 0x1fffff) << 0x15 |
       (ulong)(uint)(Idx2->Dims3).field_0.field_0.X & 0x1fffff;
  local_40.From = 0;
  eVar16 = Crop<idx2::extent,idx2::extent>(Ext,&local_40);
  local_40.Dims._0_4_ = 1;
  local_40.From = 0x100000001;
  auVar1 = vpmovsxbd_avx(ZEXT416(0xffffff));
  auVar2 = vpmaskmovd_avx2(auVar1,(undefined1  [16])local_40);
  auVar3._0_12_ = *(undefined1 (*) [12])&Idx2->DownsamplingFactor3;
  auVar3[0xc] = Idx2->DType;
  auVar3._13_3_ = *(undefined3 *)&Idx2->field_0x99;
  auVar3 = vpsllvd_avx2(auVar2,auVar3);
  auVar3 = vpmaskmovd_avx2(auVar1,auVar3);
  lVar12 = eVar16.From << 0x16;
  lVar4 = eVar16.From * 2;
  uVar13 = lVar12 >> 0xb;
  iVar8 = ((int)eVar16.From << 0xb) >> 0xb;
  local_40.From._0_4_ = auVar3._0_4_;
  local_40.From._4_4_ = auVar3._4_4_;
  local_40.Dims._0_4_ = auVar3._8_4_;
  iVar5 = (int)((ulong)lVar4 >> 0x20);
  iVar6 = iVar5 >> 0xb;
  iVar14 = (uint)local_40.From + (((int)eVar16.Dims << 0xb) >> 0xb) + iVar8 + -2;
  iVar10 = (int)(((long)(eVar16.Dims << 0x16) >> 0xb) + -0x100000000 + (uVar13 & 0xffffffff00000000)
                >> 0x20) + local_40.From._4_4_ + -1;
  iVar15 = (uint)local_40.Dims + (int)((long)(eVar16.Dims * 2) >> 0x2b) + iVar6 + -2;
  uVar9 = iVar8 - iVar8 % (int)(uint)local_40.From;
  iVar8 = (int)((ulong)lVar12 >> 0x20);
  uVar11 = (iVar8 >> 0xb) -
           (int)((long)((ulong)(uint)(iVar8 >> 0x1f) << 0x20 | uVar13 >> 0x20) %
                (long)(int)local_40.From._4_4_);
  uVar7 = iVar6 - (int)((long)((ulong)(uint)(iVar5 >> 0x1f) << 0x20 | lVar4 >> 0x2b & 0xffffffffU) %
                       (long)(int)(uint)local_40.Dims);
  (__return_storage_ptr__->super_extent).From =
       (ulong)(uVar7 & 0x1fffff) << 0x2a |
       (ulong)(uVar11 & 0x1fffff) << 0x15 | (ulong)(uVar9 & 0x1fffff);
  (__return_storage_ptr__->super_extent).Dims =
       (ulong)((int)(iVar15 - (iVar15 % (int)(uint)local_40.Dims + uVar7)) /
               (int)(uint)local_40.Dims + 1U & 0x1fffff) << 0x2a |
       (ulong)((int)(iVar10 - (iVar10 % (int)local_40.From._4_4_ + uVar11)) /
               (int)local_40.From._4_4_ + 1U & 0x1fffff) << 0x15 |
       (ulong)((int)(iVar14 - (iVar14 % (int)(uint)local_40.From + uVar9)) /
               (int)(uint)local_40.From + 1U & 0x1fffff);
  __return_storage_ptr__->Strd =
       (ulong)((uint)local_40.Dims & 0x1fffff) << 0x2a |
       ((ulong)local_40.From._4_4_ & 0x1fffff) << 0x15 | (ulong)(uint)local_40.From & 0x1fffff;
  return __return_storage_ptr__;
}

Assistant:

grid
GetGrid(const idx2_file& Idx2, const extent& Ext)
{
  auto CroppedExt = Crop(Ext, extent(Idx2.Dims3));
  v3i Strd3(1); // start with stride (1, 1, 1)
  idx2_For (int, D, 0, 3)
    Strd3[D] <<= Idx2.DownsamplingFactor3[D];

  v3i First3 = From(CroppedExt);
  v3i Last3 = Last(CroppedExt);
  Last3 = ((Last3 + Strd3 - 1) / Strd3) * Strd3; // move last to the right
  First3 = (First3 / Strd3) * Strd3; // move first to the left

  return grid(First3, (Last3 - First3) / Strd3 + 1, Strd3);
}


static void
ComputeExtentsForTraversal(const idx2_file& Idx2,
                           const extent& Ext,
                           i8 Level,
                           extent* ExtentInFiles,
                           extent* VolExtentInFiles)
{
  v3i B3, C3, F3, Ff3, Fl3;
  B3 = Idx2.BrickDims3 * Pow(Idx2.GroupBrick3, Level);
  C3 = Idx2.BricksPerChunk3s[Level] * B3;
  F3 = C3 * Idx2.ChunksPerFile3s[Level];

  Ff3 = From(Ext) / F3;
  Fl3 = Last(Ext) / F3;
  *ExtentInFiles  = extent(Ff3, Fl3 - Ff3 + 1);

  extent VolExt(Idx2.Dims3);
  v3i Vff3 = From(VolExt) / F3;
  v3i Vfl3 = Last(VolExt) / F3;
  *VolExtentInFiles  = extent(Vff3, Vfl3 - Vff3 + 1);
}

using traverse_callback = error<idx2_err_code>(const traverse_item&);

error<idx2_err_code>
TraverseHierarchy(u64 TraverseOrder,
                  const v3i& From3,
                  const v3i& Dims3,
                  const extent& Extent, // in units of traverse_item
                  const extent& VolExtent, // in units of traverse_item
                  traverse_callback Callback)
{
  idx2_RAII(array<traverse_item>, Stack, Reserve(&Stack, 64), Dealloc(&Stack));
  v3i Dims3Ext((int)NextPow2(Dims3.X), (int)NextPow2(Dims3.Y), (int)NextPow2(Dims3.Z));
  traverse_item Top;
  Top.From3 = From3;
  Top.To3 = From3 + Dims3Ext;
  Top.TraverseOrder = Top.PrevTraverseOrder = TraverseOrder;
  PushBack(&Stack, Top);
  while (Size(Stack) >= 0)
  {
    Top = Back(Stack);
    int FD = Top.TraverseOrder & 0x3;
    Top.TraverseOrder >>= 2;
    if (FD == 3)
    {
      if (Top.TraverseOrder == 3)
        Top.TraverseOrder = Top.PrevTraverseOrder;
      else
        Top.PrevTraverseOrder = Top.TraverseOrder;
      continue;
    }
    PopBack(&Stack);
    if (!(Top.To3 - Top.From3 == 1))
    {
      traverse_item First = Top, Second = Top;
      First.To3[FD] =
        Top.From3[FD] + (Top.To3[FD] - Top.From3[FD]) / 2;
      Second.From3[FD] =
        Top.From3[FD] + (Top.To3[FD] - Top.From3[FD]) / 2;
      extent Skip(First.From3, First.To3 - First.From3);
      //Second.NItemsBefore = First.NItemsBefore + Prod<u64>(Dims(Crop(Skip, Extent)));
      Second.ItemOrder = First.ItemOrder + Prod<i32>(Dims(Crop(Skip, VolExtent)));
      First.Address = Top.Address;
      Second.Address = Top.Address + Prod<u64>(First.To3 - First.From3);
      if (Second.From3 < To(Extent) && From(Extent) < Second.To3)
        PushBack(&Stack, Second);
      if (First.From3 < To(Extent) && From(Extent) < First.To3)
        PushBack(&Stack, First);
    }
    else
    {
      Top.LastItem = Size(Stack) == 0;
      idx2_PropagateIfError(Callback(Top));
    }
  }
}


}